

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O1

int ssw_loadrecord(ssw_fileinternal_t *f)

{
  mcpl_generic_filehandle_t *pmVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  FILE *pFVar5;
  bool bVar6;
  uint32_t rl;
  uint local_20;
  undefined4 uStack_1c;
  
  pmVar1 = &f->filehandle;
  if (f->reclen == 4) {
    iVar2 = mcpl_generic_fread_try(pmVar1,&local_20,4);
    if (iVar2 != 4) {
      return 0;
    }
    uVar3 = (ulong)local_20;
  }
  else {
    iVar2 = mcpl_generic_fread_try(pmVar1,&local_20,8);
    if (iVar2 != 8) {
      return 0;
    }
    uVar3 = CONCAT44(uStack_1c,local_20);
  }
  f->lbuf = uVar3;
  if (f->lbufmax < f->lbuf) {
    if (0x3fffffff < f->lbuf) {
      pFVar5 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar5 = _stdout;
      }
      pcVar4 = "too large record encountered";
      goto LAB_00102674;
    }
    free(f->buf);
    f->lbufmax = f->lbuf;
    pcVar4 = (char *)malloc(f->lbuf);
    f->buf = pcVar4;
    if (pcVar4 != (char *)0x0) goto LAB_0010253f;
  }
  else {
LAB_0010253f:
    if ((0x400 < f->lbuf) || (f->lbufmax < 0x401)) {
LAB_0010258a:
      if (f->buf == (char *)0x0) {
        pFVar5 = (FILE *)ssw_impl_stdout_data::thefh;
        if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar5 = _stdout;
        }
        fwrite("SSW Error: unable to allocate requested buffer (corrupted input?).\n",0x43,1,pFVar5)
        ;
        return 0;
      }
      mcpl_generic_fread(pmVar1,f->buf,f->lbuf);
      if (f->reclen == 4) {
        mcpl_generic_fread(pmVar1,&local_20,4);
        bVar6 = f->lbuf == (ulong)local_20;
      }
      else {
        mcpl_generic_fread(pmVar1,&local_20,8);
        bVar6 = f->lbuf == CONCAT44(uStack_1c,local_20);
      }
      return (uint)bVar6;
    }
    free(f->buf);
    f->lbufmax = 0x400;
    pcVar4 = (char *)malloc(0x400);
    f->buf = pcVar4;
    if (pcVar4 != (char *)0x0) goto LAB_0010258a;
  }
  pFVar5 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar5 = _stdout;
  }
  pcVar4 = "memory allocation failure";
LAB_00102674:
  fprintf(pFVar5,"ERROR: %s\n",pcVar4);
  exit(1);
}

Assistant:

int ssw_loadrecord(ssw_fileinternal_t* f)
{
  if (f->reclen==4) {
    uint32_t rl;
    if (!ssw_try_readbytes(f, (char*)&rl, 4))
      return 0;
    f->lbuf = rl;
  } else {
    uint64_t rl;
    if (!ssw_try_readbytes(f, (char*)&rl, 8))
      return 0;
    f->lbuf = rl;
  }

  if (f->lbuf > f->lbufmax) {
    //Very large record, must grow buffer. But first check it fits in 32 integer
    //limit (so we can cast below):
    if (f->lbuf > INT_MAX / 2 )
      ssw_error("too large record encountered");
    free(f->buf);
    f->lbufmax = f->lbuf;
    f->buf = malloc(f->lbufmax);
    if (!f->buf)
      ssw_error("memory allocation failure");
  }

  if ( f->lbuf <= SSWREAD_STDBUFSIZE
       && f->lbufmax > SSWREAD_STDBUFSIZE ) {
    //Make sure we don't hold on to very large buffers once they are no longer
    //needed:
    free(f->buf);
    f->lbufmax = SSWREAD_STDBUFSIZE;
    f->buf = malloc(f->lbufmax);
    if (!f->buf)
      ssw_error("memory allocation failure");
  }

  if (!f->buf) {
    //Could be corrupted data resulting in unusually large lbuf:
    fprintf(ssw_stdout(),
            "SSW Error: unable to allocate"
            " requested buffer (corrupted input?).\n");
    return 0;
  }

  char * buf = (char*)f->buf;
  ssw_readbytes(f, buf, f->lbuf );
  if (f->reclen==4) {
    uint32_t rl;
    ssw_readbytes(f, (char*)&rl, 4);
    return ( f->lbuf == rl );
  } else {
    uint64_t rl;
    ssw_readbytes(f, (char*)&rl, 8);
    return ( f->lbuf == rl );
  }
}